

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O1

void gen_sel_s(DisasContext_conflict6 *ctx,fopcode op1,int fd,int ft,int fs)

{
  TCGContext_conflict6 *tcg_ctx;
  TCGv_i32 c2;
  TCGTemp *pTVar1;
  TCGv_i32 pTVar2;
  uintptr_t o;
  TCGv_i32 t;
  TCGCond cond;
  TCGv_i32 pTVar3;
  uintptr_t o_1;
  TCGv_i32 t_00;
  uintptr_t o_2;
  TCGv_i32 t_01;
  TCGv_i32 pTVar4;
  
  tcg_ctx = ctx->uc->tcg_ctx;
  c2 = tcg_const_i32_mips64el(tcg_ctx,0);
  pTVar1 = tcg_temp_new_internal_mips64el(tcg_ctx,TCG_TYPE_I32,false);
  t_01 = (TCGv_i32)((long)pTVar1 - (long)tcg_ctx);
  pTVar1 = tcg_temp_new_internal_mips64el(tcg_ctx,TCG_TYPE_I32,false);
  t_00 = (TCGv_i32)((long)pTVar1 - (long)tcg_ctx);
  pTVar1 = tcg_temp_new_internal_mips64el(tcg_ctx,TCG_TYPE_I32,false);
  t = (TCGv_i32)((long)pTVar1 - (long)tcg_ctx);
  gen_load_fpr32(ctx,t_01,fd);
  gen_load_fpr32(ctx,t_00,ft);
  gen_load_fpr32(ctx,t,fs);
  pTVar2 = t_00;
  pTVar3 = t;
  pTVar4 = c2;
  if (op1 == OPC_SELNEZ_S) {
    tcg_gen_andi_i32_mips64el(tcg_ctx,t_00,t_00,1);
    cond = TCG_COND_NE;
  }
  else if (op1 == OPC_SELEQZ_S) {
    tcg_gen_andi_i32_mips64el(tcg_ctx,t_00,t_00,1);
    cond = TCG_COND_EQ;
  }
  else {
    if (op1 != OPC_SEL_S) {
      generate_exception_err(ctx,0x14,0);
      goto LAB_009aae66;
    }
    tcg_gen_andi_i32_mips64el(tcg_ctx,t_01,t_01,1);
    cond = TCG_COND_NE;
    pTVar2 = t_01;
    pTVar3 = t_00;
    pTVar4 = t;
  }
  tcg_gen_movcond_i32_mips64el(tcg_ctx,cond,t_01,pTVar2,c2,pTVar3,pTVar4);
LAB_009aae66:
  gen_store_fpr32(ctx,t_01,fd);
  tcg_temp_free_internal_mips64el(tcg_ctx,(TCGTemp *)(t + (long)tcg_ctx));
  tcg_temp_free_internal_mips64el(tcg_ctx,(TCGTemp *)(t_00 + (long)tcg_ctx));
  tcg_temp_free_internal_mips64el(tcg_ctx,(TCGTemp *)(t_01 + (long)tcg_ctx));
  tcg_temp_free_internal_mips64el(tcg_ctx,(TCGTemp *)(c2 + (long)tcg_ctx));
  return;
}

Assistant:

static void gen_sel_s(DisasContext *ctx, enum fopcode op1, int fd, int ft,
                      int fs)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    TCGv_i32 t1 = tcg_const_i32(tcg_ctx, 0);
    TCGv_i32 fp0 = tcg_temp_new_i32(tcg_ctx);
    TCGv_i32 fp1 = tcg_temp_new_i32(tcg_ctx);
    TCGv_i32 fp2 = tcg_temp_new_i32(tcg_ctx);
    gen_load_fpr32(ctx, fp0, fd);
    gen_load_fpr32(ctx, fp1, ft);
    gen_load_fpr32(ctx, fp2, fs);

    switch (op1) {
    case OPC_SEL_S:
        tcg_gen_andi_i32(tcg_ctx, fp0, fp0, 1);
        tcg_gen_movcond_i32(tcg_ctx, TCG_COND_NE, fp0, fp0, t1, fp1, fp2);
        break;
    case OPC_SELEQZ_S:
        tcg_gen_andi_i32(tcg_ctx, fp1, fp1, 1);
        tcg_gen_movcond_i32(tcg_ctx, TCG_COND_EQ, fp0, fp1, t1, fp2, t1);
        break;
    case OPC_SELNEZ_S:
        tcg_gen_andi_i32(tcg_ctx, fp1, fp1, 1);
        tcg_gen_movcond_i32(tcg_ctx, TCG_COND_NE, fp0, fp1, t1, fp2, t1);
        break;
    default:
        MIPS_INVAL("gen_sel_s");
        generate_exception_end(ctx, EXCP_RI);
        break;
    }

    gen_store_fpr32(ctx, fp0, fd);
    tcg_temp_free_i32(tcg_ctx, fp2);
    tcg_temp_free_i32(tcg_ctx, fp1);
    tcg_temp_free_i32(tcg_ctx, fp0);
    tcg_temp_free_i32(tcg_ctx, t1);
}